

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VANAnalyzer.cpp
# Opt level: O0

void __thiscall VanAnalyzer::VanAnalyzer(VanAnalyzer *this)

{
  VanAnalyzerSettings *this_00;
  U64 *local_40;
  VanAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__VanAnalyzer_0010cc58;
  this->VanFrameTypeForDisplay[8] = "ERROR";
  this->VanFrameTypeForDisplay[6] = "ACK";
  this->VanFrameTypeForDisplay[7] = "EOF";
  this->VanFrameTypeForDisplay[4] = "FCS";
  this->VanFrameTypeForDisplay[5] = "EOD";
  this->VanFrameTypeForDisplay[2] = "COM";
  this->VanFrameTypeForDisplay[3] = "DATA";
  this->VanFrameTypeForDisplay[0] = "SOF";
  this->VanFrameTypeForDisplay[1] = "IDENT";
  this_00 = (VanAnalyzerSettings *)operator_new(0x40);
  VanAnalyzerSettings::VanAnalyzerSettings(this_00);
  std::auto_ptr<VanAnalyzerSettings>::auto_ptr(&this->mSettings,this_00);
  std::auto_ptr<VanAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  this->mBitPositions[0] = 0;
  local_40 = this->mBitPositions + 1;
  do {
    *local_40 = 0;
    local_40 = local_40 + 1;
  } while (local_40 != (U64 *)&this->mBitPos);
  this->mBitPos = '\0';
  this->mStartOfFieldSampleNumber = 0;
  this->mStartOfIdenFieldSampleNumber = 0;
  this->mPreviousNonManchesterBitPosition = 0;
  this->mbitCount = '\0';
  this->mbyteCount = '\0';
  this->mByte = '\0';
  this->mask = 0x80;
  this->mFrameStart = true;
  this->mEofFound = false;
  VanSimulationDataGenerator::VanSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  this->mNumSamplesIn8Bits = 0;
  this->mIdent = 0;
  this->mCOM = '\0';
  std::auto_ptr<VanAnalyzerSettings>::get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

VanAnalyzer::VanAnalyzer() : Analyzer2(), mSettings( new VanAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );

    UseFrameV2();
}